

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *out,QUrl *url)

{
  long lVar1;
  bool bVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QByteArray u;
  QByteArray *in_stack_ffffffffffffff78;
  QByteArray *in_stack_ffffffffffffff80;
  QDataStream *in_stack_ffffffffffffff88;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_44;
  QUrl *in_stack_ffffffffffffffc0;
  FormattingOptions options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options.i = -0x55555556;
  QByteArray::QByteArray((QByteArray *)0x30094b);
  bVar2 = QUrl::isValid((QUrl *)in_stack_ffffffffffffff78);
  if (bVar2) {
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_44,FullyEncoded);
    QUrl::toEncoded(in_stack_ffffffffffffffc0,options);
    QByteArray::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QByteArray::~QByteArray((QByteArray *)0x3009ae);
  }
  operator<<(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  QByteArray::~QByteArray((QByteArray *)0x3009f3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QUrl &url)
{
    QByteArray u;
    if (url.isValid())
        u = url.toEncoded();
    out << u;
    return out;
}